

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

void __thiscall
dg::vr::ValueRelations::set<llvm::Value_const*,unsigned_long>
          (ValueRelations *this,Value **lt,Type rel,unsigned_long *rt)

{
  bool ch_00;
  ValueRelations *in_RDI;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar1;
  bool ch;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> rtHPair;
  Type in_stack_0000006c;
  Bucket *in_stack_00000070;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> ltHPair;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  ValueRelations *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  reference_wrapper<const_dg::vr::Bucket> in_stack_ffffffffffffff90;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> local_30 [3];
  
  pVar1 = get((ValueRelations *)in_stack_ffffffffffffff90._M_data,
              (V)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
  local_30[0].first = pVar1.first._M_data;
  local_30[0].second = pVar1.second;
  pVar1 = get(in_stack_ffffffffffffff80,
              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    get((ValueRelations *)in_stack_ffffffffffffff90._M_data,
        (V)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
    std::pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool>::operator=
              (local_30,(type)&stack0xffffffffffffff90);
  }
  std::reference_wrapper::operator_cast_to_Bucket_
            ((reference_wrapper<const_dg::vr::Bucket> *)0x1ea031);
  std::reference_wrapper::operator_cast_to_Bucket_
            ((reference_wrapper<const_dg::vr::Bucket> *)0x1ea04b);
  ch_00 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                    ((RelationsGraph<dg::vr::ValueRelations> *)ltHPair.first._M_data,
                     in_stack_00000070,in_stack_0000006c,(Bucket *)rtHPair._8_8_,
                     (Relations *)rtHPair.first._M_data);
  updateChanged(in_RDI,ch_00);
  return;
}

Assistant:

void set(const X &lt, Relations::Type rel, const Y &rt) {
        auto ltHPair = get(lt);
        auto rtHPair = get(rt);
        if (rtHPair.second) {
            ltHPair = get(lt);
            assert(!ltHPair.second);
        }
        bool ch = graph.addRelation(ltHPair.first, rel, rtHPair.first);
        updateChanged(ch);
    }